

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5MultiIterNew(Fts5Index *p,Fts5Structure *pStruct,int flags,Fts5Colset *pColset,u8 *pTerm,
                     int nTerm,int iLevel,int nSegment,Fts5Iter **ppOut)

{
  long lVar1;
  int *piVar2;
  Fts5Hash *p_00;
  sqlite3_mutex *psVar3;
  bool bVar4;
  Fts5Data *p_01;
  Fts5StructureLevel *pFVar5;
  u8 *puVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  Fts5Iter *pIter;
  size_t sVar13;
  code *pcVar14;
  Fts5HashEntry *pFVar15;
  char *zSql;
  Mem *pMem;
  Fts5DlidxIter *pFVar16;
  Fts5Data *pFVar17;
  Fts5Data *pFVar18;
  ushort uVar19;
  ulong uVar20;
  u32 uVar21;
  long lVar22;
  u8 *puVar23;
  Fts5StructureSegment *pFVar24;
  u32 nData;
  uint uVar25;
  long lVar26;
  undefined4 in_register_0000008c;
  u32 uVar27;
  ulong uVar28;
  Fts5SegIter *pFVar29;
  uint uVar30;
  Vdbe *p_1;
  Vdbe *p_02;
  Fts5Structure *pFVar31;
  bool bVar32;
  int nList;
  u32 nKeep;
  u8 *z;
  u32 local_fc;
  int *local_f8;
  byte local_e9;
  Fts5Index *local_e8;
  long local_e0;
  uint local_d4;
  Fts5Structure *local_d0;
  ulong local_c8;
  u8 *local_c0;
  u8 *local_b8;
  u8 *local_b0;
  u32 local_a4;
  long local_a0;
  Fts5HashEntry *local_98;
  uint local_8c;
  long local_88;
  Fts5Data *local_80;
  long local_78;
  Fts5Data *local_70;
  int local_64;
  int local_60;
  u32 local_5c;
  sqlite3_stmt **local_58;
  Fts5Buffer *local_50;
  Fts5Iter *local_48;
  Fts5Iter **local_40;
  Fts5StructureLevel *local_38;
  
  local_c8 = CONCAT44(in_register_0000008c,nTerm);
  uVar30 = 0;
  if (p->rc == 0) {
    if (iLevel < 0) {
      uVar30 = (pStruct->nSegment + 1) - (uint)(p->pHash == (Fts5Hash *)0x0);
    }
    else {
      uVar25 = pStruct->aLevel[(uint)iLevel].nSeg;
      uVar30 = nSegment;
      if ((int)uVar25 < nSegment) {
        uVar30 = uVar25;
      }
    }
  }
  local_d4 = flags;
  local_d0 = pStruct;
  local_c0 = pTerm;
  pIter = fts5MultiIterAlloc(p,uVar30);
  *ppOut = pIter;
  if (pIter == (Fts5Iter *)0x0) {
    return;
  }
  local_40 = ppOut;
  piVar2 = &p->rc;
  pIter->bRev = local_d4 >> 1 & 1;
  pIter->bSkipEmpty = (byte)local_d4 >> 4 & 1;
  pIter->pColset = pColset;
  if ((local_d4 & 0x20) == 0) {
    fts5IterSetOutputCb(piVar2,pIter);
  }
  if (*piVar2 != 0) goto LAB_001a46e1;
  local_f8 = piVar2;
  if (iLevel < 0) {
    iVar12 = local_d0->nLevel;
    p_00 = p->pHash;
    local_e8 = p;
    if (p_00 == (Fts5Hash *)0x0) {
      pFVar15 = (Fts5HashEntry *)0x0;
    }
    else {
      local_fc = 0;
      local_b0 = (u8 *)0x0;
      iVar10 = (int)local_c8;
      if (local_c0 == (u8 *)0x0) {
        puVar23 = (u8 *)0x0;
LAB_001a3cf2:
        local_b8 = (u8 *)0x0;
        iVar10 = sqlite3Fts5HashScanInit(p_00,(char *)puVar23,iVar10);
        p->rc = iVar10;
        sqlite3Fts5HashScanEntry(p->pHash,(char **)&local_b0,&local_b8,(int *)&local_fc);
        puVar23 = local_b0;
        if (local_b0 == (u8 *)0x0) {
          uVar21 = 0;
        }
        else {
          sVar13 = strlen((char *)local_b0);
          uVar21 = (u32)sVar13;
        }
        puVar6 = local_b8;
        if ((local_b8 == (u8 *)0x0) ||
           (pFVar17 = (Fts5Data *)sqlite3Fts5MallocZero(local_f8,0x10), pFVar17 == (Fts5Data *)0x0))
        {
          pFVar17 = (Fts5Data *)0x0;
        }
        else {
          pFVar17->p = puVar6;
        }
      }
      else {
        puVar23 = local_c0;
        if ((local_d4 & 8) != 0) goto LAB_001a3cf2;
        if (iVar10 < 1) {
          uVar30 = 0xd;
        }
        else {
          uVar20 = (local_c8 & 0xffffffff) + 1;
          uVar30 = 0xd;
          do {
            uVar30 = uVar30 * 8 ^ uVar30 ^ (uint)local_c0[uVar20 - 2];
            uVar20 = uVar20 - 1;
          } while (1 < uVar20);
        }
        pFVar15 = p_00->aSlot[(ulong)uVar30 % (ulong)(uint)p_00->nSlot];
        iVar8 = 0;
        if (pFVar15 != (Fts5HashEntry *)0x0) {
          do {
            if ((pFVar15->nKey + 1 == (int)local_c8) &&
               (iVar8 = bcmp(pFVar15 + 1,local_c0,(long)iVar10), iVar8 == 0)) {
              iVar10 = pFVar15->nData;
              iVar9 = sqlite3_initialize();
              iVar8 = 7;
              if (iVar9 == 0) {
                local_a0 = (long)((int)local_c8 + 0x31);
                local_e0 = iVar10 - local_a0;
                pFVar17 = (Fts5Data *)sqlite3Malloc(local_e0 + 0x1a);
                if (pFVar17 != (Fts5Data *)0x0) {
                  local_98 = (Fts5HashEntry *)((long)&pFVar17->p + (long)(-0x21 - (int)local_c8));
                  local_70 = pFVar17 + 1;
                  iVar10 = (int)local_e0;
                  memcpy(local_70,(void *)((long)&pFVar15->pHashNext + local_a0),(long)(int)local_e0
                        );
                  iVar8 = fts5HashAddPoslistSize(p_00,pFVar15,local_98);
                  local_fc = iVar10 + iVar8;
                  *local_f8 = 0;
                  pFVar17->p = (u8 *)local_70;
                  goto LAB_001a3dd4;
                }
              }
              break;
            }
            pFVar15 = pFVar15->pHashNext;
            iVar8 = 0;
          } while (pFVar15 != (Fts5HashEntry *)0x0);
        }
        local_fc = 0;
        *local_f8 = iVar8;
        pFVar17 = (Fts5Data *)0x0;
LAB_001a3dd4:
        local_b0 = local_c0;
        piVar2 = &pIter->aSeg[0].flags;
        *(byte *)piVar2 = (byte)*piVar2 | 1;
        uVar21 = (u32)local_c8;
        puVar23 = local_c0;
      }
      if (pFVar17 != (Fts5Data *)0x0) {
        pIter->aSeg[0].term.n = 0;
        sqlite3Fts5BufferAppendBlob(local_f8,&pIter->aSeg[0].term,uVar21,puVar23);
        pFVar17->szLeaf = local_fc;
        pFVar17->nn = local_fc;
        pIter->aSeg[0].pLeaf = pFVar17;
        bVar7 = sqlite3Fts5GetVarint(pFVar17->p,(u64 *)&pIter->aSeg[0].iRowid);
        pIter->aSeg[0].iLeafOffset = (uint)bVar7;
        pIter->aSeg[0].iEndofDoclist = pFVar17->nn;
        if ((local_d4 & 2) == 0) {
          fts5SegIterLoadNPos(local_e8,pIter->aSeg);
        }
        else {
          piVar2 = &pIter->aSeg[0].flags;
          *(byte *)piVar2 = (byte)*piVar2 | 2;
          fts5SegIterReverseInitPage(local_e8,pIter->aSeg);
        }
      }
      if ((pIter->aSeg[0].flags & 2) == 0) {
        if (local_e8->pConfig->eDetail == 1) {
          pcVar14 = fts5SegIterNext_None;
        }
        else {
          pcVar14 = fts5SegIterNext;
        }
        pIter->aSeg[0].xNext = pcVar14;
      }
      else {
        pIter->aSeg[0].xNext = fts5SegIterNext_Reverse;
      }
      pFVar15 = (Fts5HashEntry *)0x1;
    }
    p = local_e8;
    if (0 < iVar12) {
      local_38 = local_d0->aLevel + iVar12;
      pFVar31 = (Fts5Structure *)local_d0->aLevel;
      local_70 = (Fts5Data *)pIter->aSeg;
      local_8c = local_d4 & 8;
      local_58 = &local_e8->pIdxSelect;
      puVar23 = local_c0;
      local_48 = pIter;
      do {
        if (0 < (long)*(int *)&pFVar31->field_0x4) {
          pFVar15 = (Fts5HashEntry *)(long)(int)pFVar15;
          lVar22 = (long)*(int *)&pFVar31->field_0x4;
          local_d0 = pFVar31;
LAB_001a3f32:
          lVar26 = lVar22 + -1;
          pFVar24 = (Fts5StructureSegment *)(lVar26 * 0xc + pFVar31->nWriteCounter);
          pFVar29 = (Fts5SegIter *)((long)pFVar15 * 0x78 + (long)local_70);
          if (puVar23 != (u8 *)0x0) {
            pFVar29->iRowid = 0;
            pFVar29->nPos = 0;
            pFVar29->bDel = '\0';
            *(undefined3 *)&pFVar29->field_0x75 = 0;
            (pFVar29->term).p = (u8 *)0x0;
            (pFVar29->term).n = 0;
            (pFVar29->term).nSpace = 0;
            pFVar29->aRowidOffset = (int *)0x0;
            pFVar29->pDlidx = (Fts5DlidxIter *)0x0;
            pFVar29->iPgidxOff = 0;
            pFVar29->iEndofDoclist = 0;
            pFVar29->iRowidOffset = 0;
            pFVar29->nRowidOffset = 0;
            pFVar29->xNext = (_func_void_Fts5Index_ptr_Fts5SegIter_ptr_int_ptr *)0x0;
            pFVar29->iTermLeafPgno = 0;
            pFVar29->iTermLeafOffset = 0;
            pFVar29->pNextLeaf = (Fts5Data *)0x0;
            *(undefined8 *)&pFVar29->iLeafOffset = 0;
            pFVar29->flags = 0;
            pFVar29->iLeafPgno = 0;
            pFVar29->pLeaf = (Fts5Data *)0x0;
            pFVar29->pSeg = pFVar24;
            p_02 = (Vdbe *)*local_58;
            if (p_02 == (Vdbe *)0x0) {
              local_98 = pFVar15;
              zSql = sqlite3_mprintf("SELECT pgno FROM \'%q\'.\'%q_idx\' WHERE segid=? AND term<=? ORDER BY term DESC LIMIT 1"
                                     ,p->pConfig->zDb,p->pConfig->zName);
              fts5IndexPrepareStmt(p,local_58,zSql);
              p_02 = (Vdbe *)p->pIdxSelect;
              pFVar15 = local_98;
            }
            if (*local_f8 != 0) goto LAB_001a4587;
            iVar12 = 1;
            local_98 = pFVar15;
            local_78 = lVar26;
            sqlite3_bind_int64((sqlite3_stmt *)p_02,1,(long)pFVar24->iSegid);
            bindText((sqlite3_stmt *)p_02,2,local_c0,(int)local_c8,(_func_void_void_ptr *)0x0,'\0');
            iVar10 = sqlite3_step((sqlite3_stmt *)p_02);
            bVar32 = true;
            if (iVar10 == 100) {
              pMem = columnMem((sqlite3_stmt *)p_02,0);
              uVar20 = sqlite3VdbeIntValue(pMem);
              columnMallocFailure((sqlite3_stmt *)p_02);
              iVar12 = (int)uVar20 >> 1;
              bVar32 = (uVar20 & 1) == 0;
            }
            local_e9 = bVar32;
            iVar10 = sqlite3_reset((sqlite3_stmt *)p_02);
            *local_f8 = iVar10;
            iVar10 = vdbeUnbind(p_02,2);
            if ((iVar10 == 0) && (psVar3 = p_02->db->mutex, psVar3 != (sqlite3_mutex *)0x0)) {
              (*sqlite3Config.mutex.xMutexLeave)(psVar3);
            }
            local_64 = pFVar24->pgnoFirst;
            iVar10 = local_64;
            if (local_64 < iVar12) {
              iVar10 = iVar12;
            }
            pFVar29->iLeafPgno = iVar10 + -1;
            fts5SegIterNextPage(p,pFVar29);
            pFVar17 = pFVar29->pLeaf;
            if (pFVar17 != (Fts5Data *)0x0) {
              puVar23 = pFVar17->p;
              iVar10 = pFVar17->szLeaf;
              iVar8 = pFVar17->nn;
              local_b8 = (u8 *)((ulong)local_b8 & 0xffffffff00000000);
              local_88 = lVar22;
              local_80 = pFVar17;
              local_60 = iVar12;
              iVar12 = sqlite3Fts5GetVarint32(puVar23 + iVar10,&local_a4);
              if ((int)local_a4 <= iVar8) {
                local_a0 = CONCAT44(local_a0._4_4_,iVar12 + iVar10);
                nData = 0;
                local_e0 = CONCAT44(local_e0._4_4_,iVar8);
                uVar27 = local_a4;
                uVar21 = local_a4;
LAB_001a4153:
                local_fc = (u32)puVar23[(int)uVar27];
                if ((char)puVar23[(int)uVar27] < '\0') {
                  iVar12 = sqlite3Fts5GetVarint32(puVar23 + (int)uVar27,&local_fc);
                  iVar12 = uVar27 + iVar12;
                  iVar8 = (int)local_e0;
                }
                else {
                  iVar12 = uVar27 + 1;
                }
                uVar30 = (uint)local_b8;
                if (nData <= (uint)local_b8) {
                  uVar25 = nData;
                  if ((uint)local_b8 != nData) {
LAB_001a4208:
                    nData = uVar25;
                    iVar10 = (int)local_a0;
                    if (iVar8 <= (int)local_a0) {
                      local_b0 = (u8 *)CONCAT44(local_b0._4_4_,iVar12);
                      if (local_8c == 0) goto LAB_001a4334;
                      goto LAB_001a4284;
                    }
                    iVar12 = sqlite3Fts5GetVarint32(puVar23 + (int)local_a0,(u32 *)&local_b8);
                    uVar21 = uVar21 + (uint)local_b8;
                    if ((int)uVar21 < (int)local_e0) {
                      local_a0 = CONCAT44(local_a0._4_4_,iVar10 + iVar12);
                      uVar27 = uVar21 + 1;
                      local_b8 = (u8 *)CONCAT44(local_b8._4_4_,(uint)puVar23[(int)uVar21]);
                      iVar8 = (int)local_e0;
                      if ((char)puVar23[(int)uVar21] < '\0') {
                        iVar12 = sqlite3Fts5GetVarint32(puVar23 + (int)uVar21,(u32 *)&local_b8);
                        uVar27 = iVar12 + uVar21;
                        iVar8 = (int)local_e0;
                      }
                      goto LAB_001a4153;
                    }
                    goto LAB_001a43fc;
                  }
                  uVar30 = (uint)local_c8 - nData;
                  if (local_fc < uVar30) {
                    uVar30 = local_fc;
                  }
                  if (uVar30 == 0) {
                    uVar11 = 0;
                  }
                  else {
                    uVar20 = 0;
                    do {
                      uVar11 = (uint)uVar20;
                      if (puVar23[iVar12 + uVar11] != local_c0[nData + uVar11]) break;
                      uVar20 = uVar20 + 1;
                      uVar11 = uVar30;
                    } while (uVar30 != uVar20);
                    iVar8 = (int)local_e0;
                  }
                  uVar25 = uVar11 + nData;
                  uVar30 = nData;
                  if (uVar25 == (uint)local_c8) {
                    if (uVar11 != local_fc) goto LAB_001a4322;
                    local_b0 = (u8 *)CONCAT44(local_b0._4_4_,iVar12);
                    local_a4 = uVar21;
                    goto LAB_001a434e;
                  }
                  if ((local_fc <= uVar11) || (puVar23[uVar11 + iVar12] <= local_c0[uVar25]))
                  goto LAB_001a4208;
                }
LAB_001a4322:
                local_b0 = (u8 *)CONCAT44(local_b0._4_4_,iVar12);
                nData = uVar30;
                local_a4 = uVar21;
                if (local_8c != 0) goto LAB_001a434e;
LAB_001a4334:
                local_b0 = (u8 *)CONCAT44(local_b0._4_4_,iVar12);
                sqlite3_free(local_80);
                pFVar29->pLeaf = (Fts5Data *)0x0;
                lVar22 = local_88;
                p = local_e8;
                iVar12 = local_60;
                goto LAB_001a441c;
              }
              *local_f8 = 0x10b;
              lVar22 = local_88;
              iVar12 = local_60;
            }
            goto LAB_001a441c;
          }
          fts5SegIterInit(p,pFVar24,pFVar29);
          goto LAB_001a4587;
        }
LAB_001a46c5:
        pFVar31 = (Fts5Structure *)&pFVar31->nSegment;
      } while (pFVar31 < local_38);
    }
  }
  else if (0 < (int)uVar30) {
    pFVar5 = local_d0->aLevel;
    pFVar29 = pIter->aSeg;
    lVar22 = (ulong)uVar30 * 0xc + -0xc;
    do {
      fts5SegIterInit(p,(Fts5StructureSegment *)
                        ((long)&(pFVar5[(uint)iLevel].aSeg)->iSegid + lVar22),pFVar29);
      lVar22 = lVar22 + -0xc;
      pFVar29 = pFVar29 + 1;
    } while (lVar22 != -0xc);
  }
  if (*local_f8 == 0) {
    if (1 < pIter->nSeg) {
      uVar30 = pIter->nSeg + 1;
      do {
        iVar12 = fts5MultiIterDoCompare(pIter,uVar30 - 2);
        if (iVar12 != 0) {
          if (*local_f8 == 0) {
            (*pIter->aSeg[iVar12].xNext)(p,pIter->aSeg + iVar12,(int *)0x0);
          }
          fts5MultiIterAdvanced(p,pIter,iVar12,uVar30 - 2);
        }
        uVar30 = uVar30 - 1;
      } while (2 < uVar30);
    }
    uVar19 = pIter->aFirst[1].iFirst;
    pFVar17 = pIter->aSeg[uVar19].pLeaf;
    (pIter->base).bEof = pFVar17 == (Fts5Data *)0x0;
    pIter->iSwitchRowid = pIter->aSeg[uVar19].iRowid;
    if ((pIter->bSkipEmpty == '\0') || (*local_f8 != 0)) {
      if (pFVar17 == (Fts5Data *)0x0) {
        return;
      }
    }
    else {
      if (pFVar17 == (Fts5Data *)0x0) {
        return;
      }
      if (pIter->aSeg[uVar19].nPos == 0) {
        fts5MultiIterNext(p,pIter,0,0);
        return;
      }
    }
    (*pIter->xSetOutputs)(pIter,pIter->aSeg + uVar19);
    return;
  }
LAB_001a46e1:
  fts5MultiIterFree(pIter);
  *local_40 = (Fts5Iter *)0x0;
  return;
  while( true ) {
    iVar12 = pFVar17->szLeaf;
    if (iVar12 < pFVar17->nn) break;
LAB_001a4284:
    p = local_e8;
    fts5SegIterNextPage(local_e8,pFVar29);
    pFVar17 = pFVar29->pLeaf;
    lVar22 = local_88;
    iVar12 = local_60;
    if (pFVar17 == (Fts5Data *)0x0) goto LAB_001a441c;
  }
  local_e0 = CONCAT44(local_e0._4_4_,pFVar17->nn);
  puVar23 = pFVar17->p;
  iVar10 = sqlite3Fts5GetVarint32(puVar23 + iVar12,(u32 *)&local_b0);
  uVar21 = (u32)local_b0;
  if (((long)(int)(u32)local_b0 < 4) || (iVar12 <= (int)(u32)local_b0)) {
LAB_001a43fc:
    *local_f8 = 0x10b;
    lVar22 = local_88;
    p = local_e8;
    iVar12 = local_60;
  }
  else {
    local_a0 = CONCAT44(local_a0._4_4_,iVar10 + iVar12);
    local_b8 = (u8 *)((ulong)local_b8 & 0xffffffff00000000);
    local_a4 = (u32)local_b0;
    iVar12 = sqlite3Fts5GetVarint32(puVar23 + (int)(u32)local_b0,&local_fc);
    iVar12 = iVar12 + uVar21;
    local_b0 = (u8 *)CONCAT44(local_b0._4_4_,iVar12);
    iVar8 = (int)local_e0;
    nData = 0;
LAB_001a434e:
    piVar2 = local_f8;
    iVar10 = local_fc + iVar12;
    pFVar29->iLeafOffset = iVar10;
    if ((local_fc == 0) || (iVar8 < iVar10)) goto LAB_001a43fc;
    pFVar29->iTermLeafOffset = iVar10;
    pFVar29->iTermLeafPgno = pFVar29->iLeafPgno;
    local_50 = &pFVar29->term;
    (pFVar29->term).n = 0;
    local_e0 = CONCAT44(local_e0._4_4_,iVar8);
    local_80 = (Fts5Data *)(ulong)local_fc;
    sqlite3Fts5BufferAppendBlob(local_f8,local_50,nData,local_c0);
    sqlite3Fts5BufferAppendBlob(piVar2,local_50,(u32)local_80,puVar23 + iVar12);
    iVar12 = (int)local_a0;
    if ((int)local_a0 < (int)local_e0) {
      iVar8 = sqlite3Fts5GetVarint32(puVar23 + (int)local_a0,&local_5c);
      iVar10 = uVar21 + local_5c;
      iVar12 = iVar12 + iVar8;
    }
    else {
      iVar10 = pFVar29->pLeaf->nn + 1;
    }
    p = local_e8;
    pFVar29->iEndofDoclist = iVar10;
    pFVar29->iPgidxOff = iVar12;
    fts5SegIterLoadRowid(local_e8,pFVar29);
    fts5SegIterLoadNPos(p,pFVar29);
    lVar22 = local_88;
    iVar12 = local_60;
  }
LAB_001a441c:
  if (*local_f8 != 0 || local_8c != 0) goto LAB_001a4435;
  uVar30 = pFVar29->flags;
  uVar25 = uVar30 | 1;
  pFVar29->flags = uVar25;
  if (pFVar29->pLeaf == (Fts5Data *)0x0) goto LAB_001a4435;
  if ((local_d4 & 2) != 0) {
    uVar25 = uVar30 | 3;
    pFVar29->flags = uVar25;
  }
  if (local_64 <= iVar12 && (local_e9 & 1) == 0) {
    if ((pFVar29->iTermLeafPgno != pFVar29->iLeafPgno) ||
       (pFVar29->pLeaf->szLeaf <= pFVar29->iEndofDoclist)) {
      pFVar16 = fts5DlidxIterInit(p,uVar25 & 2,pFVar29->pSeg->iSegid,pFVar29->iTermLeafPgno);
      pFVar29->pDlidx = pFVar16;
    }
  }
  if ((local_d4 & 2) == 0) goto LAB_001a4435;
  if (pFVar29->pDlidx == (Fts5DlidxIter *)0x0) {
    uVar20 = (ulong)pFVar29->iLeafPgno;
    iVar12 = 4;
    if (pFVar29->iTermLeafPgno == pFVar29->iLeafPgno) {
      iVar12 = pFVar29->iTermLeafOffset;
    }
    lVar26 = (long)iVar12;
    do {
      lVar1 = lVar26 + 1;
      if (-1 < (char)pFVar29->pLeaf->p[lVar26]) break;
      bVar32 = lVar26 < iVar12 + 8;
      lVar26 = lVar1;
    } while (bVar32);
    pFVar29->iLeafOffset = (int)lVar1;
    if (pFVar29->pLeaf->szLeaf <= pFVar29->iEndofDoclist) {
      pFVar24 = pFVar29->pSeg;
      uVar28 = 0;
      pFVar17 = (Fts5Data *)0x0;
      local_88 = lVar22;
      do {
        do {
          iVar12 = (int)uVar28;
          if ((*local_f8 != 0) || ((long)pFVar24->pgnoLast <= (long)uVar20)) goto LAB_001a4506;
          pFVar18 = fts5DataRead(local_e8,uVar20 + ((ulong)(uint)pFVar24->iSegid << 0x25) + 1);
          uVar20 = uVar20 + 1;
        } while (pFVar18 == (Fts5Data *)0x0);
        local_e0 = CONCAT44(local_e0._4_4_,pFVar18->szLeaf);
        bVar32 = pFVar18->p[1] != '\0';
        bVar4 = *pFVar18->p != '\0';
        local_a0 = CONCAT44(local_a0._4_4_,pFVar18->nn);
        p_01 = pFVar18;
        if (bVar32 || bVar4) {
          uVar28 = uVar20 & 0xffffffff;
          p_01 = pFVar17;
        }
        iVar12 = (int)uVar28;
        if (bVar32 || bVar4) {
          pFVar17 = pFVar18;
        }
        sqlite3_free(p_01);
      } while ((int)local_a0 <= (int)local_e0);
      goto LAB_001a4506;
    }
  }
  else {
    iVar12 = pFVar29->pDlidx->aLvl[0].iLeafPgno;
    local_88 = lVar22;
    pFVar17 = fts5DataRead(p,((ulong)(uint)pFVar29->pSeg->iSegid << 0x25) + (long)iVar12);
LAB_001a4506:
    lVar22 = local_88;
    if (pFVar17 != (Fts5Data *)0x0) {
      sqlite3_free(pFVar29->pLeaf);
      pFVar29->pLeaf = pFVar17;
      pFVar29->iLeafPgno = iVar12;
      uVar19 = *(ushort *)pFVar17->p;
      uVar19 = uVar19 << 8 | uVar19 >> 8;
      bVar7 = sqlite3Fts5GetVarint
                        ((uchar *)((ulong)uVar19 + (long)pFVar17->p),(u64 *)&pFVar29->iRowid);
      pFVar29->iLeafOffset = (uint)bVar7 + (uint)uVar19;
      if (pFVar17->szLeaf < pFVar17->nn) {
        sqlite3Fts5GetVarint32(pFVar17->p + pFVar17->szLeaf,(u32 *)&local_b0);
        iVar12 = (u32)local_b0;
      }
      else {
        iVar12 = pFVar17->nn + 1;
      }
      pFVar29->iEndofDoclist = iVar12;
    }
  }
  p = local_e8;
  fts5SegIterReverseInitPage(local_e8,pFVar29);
LAB_001a4435:
  if ((pFVar29->flags & 2) == 0) {
    if (p->pConfig->eDetail == 1) {
      pcVar14 = fts5SegIterNext_None;
    }
    else {
      pcVar14 = fts5SegIterNext;
    }
  }
  else {
    pcVar14 = fts5SegIterNext_Reverse;
  }
  pFVar29->xNext = pcVar14;
  pFVar15 = local_98;
  lVar26 = local_78;
  pFVar31 = local_d0;
LAB_001a4587:
  pFVar15 = (Fts5HashEntry *)((long)&pFVar15->pHashNext + 1);
  bVar32 = lVar22 < 2;
  puVar23 = local_c0;
  lVar22 = lVar26;
  pIter = local_48;
  if (bVar32) goto LAB_001a46c5;
  goto LAB_001a3f32;
}

Assistant:

static void fts5MultiIterNew(
  Fts5Index *p,                   /* FTS5 backend to iterate within */
  Fts5Structure *pStruct,         /* Structure of specific index */
  int flags,                      /* FTS5INDEX_QUERY_XXX flags */
  Fts5Colset *pColset,            /* Colset to filter on (or NULL) */
  const u8 *pTerm, int nTerm,     /* Term to seek to (or NULL/0) */
  int iLevel,                     /* Level to iterate (-1 for all) */
  int nSegment,                   /* Number of segments to merge (iLevel>=0) */
  Fts5Iter **ppOut                /* New object */
){
  int nSeg = 0;                   /* Number of segment-iters in use */
  int iIter = 0;                  /* */
  int iSeg;                       /* Used to iterate through segments */
  Fts5StructureLevel *pLvl;
  Fts5Iter *pNew;

  assert( (pTerm==0 && nTerm==0) || iLevel<0 );

  /* Allocate space for the new multi-seg-iterator. */
  if( p->rc==SQLITE_OK ){
    if( iLevel<0 ){
      assert( pStruct->nSegment==fts5StructureCountSegments(pStruct) );
      nSeg = pStruct->nSegment;
      nSeg += (p->pHash ? 1 : 0);
    }else{
      nSeg = MIN(pStruct->aLevel[iLevel].nSeg, nSegment);
    }
  }
  *ppOut = pNew = fts5MultiIterAlloc(p, nSeg);
  if( pNew==0 ) return;
  pNew->bRev = (0!=(flags & FTS5INDEX_QUERY_DESC));
  pNew->bSkipEmpty = (0!=(flags & FTS5INDEX_QUERY_SKIPEMPTY));
  pNew->pColset = pColset;
  if( (flags & FTS5INDEX_QUERY_NOOUTPUT)==0 ){
    fts5IterSetOutputCb(&p->rc, pNew);
  }

  /* Initialize each of the component segment iterators. */
  if( p->rc==SQLITE_OK ){
    if( iLevel<0 ){
      Fts5StructureLevel *pEnd = &pStruct->aLevel[pStruct->nLevel];
      if( p->pHash ){
        /* Add a segment iterator for the current contents of the hash table. */
        Fts5SegIter *pIter = &pNew->aSeg[iIter++];
        fts5SegIterHashInit(p, pTerm, nTerm, flags, pIter);
      }
      for(pLvl=&pStruct->aLevel[0]; pLvl<pEnd; pLvl++){
        for(iSeg=pLvl->nSeg-1; iSeg>=0; iSeg--){
          Fts5StructureSegment *pSeg = &pLvl->aSeg[iSeg];
          Fts5SegIter *pIter = &pNew->aSeg[iIter++];
          if( pTerm==0 ){
            fts5SegIterInit(p, pSeg, pIter);
          }else{
            fts5SegIterSeekInit(p, pTerm, nTerm, flags, pSeg, pIter);
          }
        }
      }
    }else{
      pLvl = &pStruct->aLevel[iLevel];
      for(iSeg=nSeg-1; iSeg>=0; iSeg--){
        fts5SegIterInit(p, &pLvl->aSeg[iSeg], &pNew->aSeg[iIter++]);
      }
    }
    assert( iIter==nSeg );
  }

  /* If the above was successful, each component iterators now points 
  ** to the first entry in its segment. In this case initialize the 
  ** aFirst[] array. Or, if an error has occurred, free the iterator
  ** object and set the output variable to NULL.  */
  if( p->rc==SQLITE_OK ){
    for(iIter=pNew->nSeg-1; iIter>0; iIter--){
      int iEq;
      if( (iEq = fts5MultiIterDoCompare(pNew, iIter)) ){
        Fts5SegIter *pSeg = &pNew->aSeg[iEq];
        if( p->rc==SQLITE_OK ) pSeg->xNext(p, pSeg, 0);
        fts5MultiIterAdvanced(p, pNew, iEq, iIter);
      }
    }
    fts5MultiIterSetEof(pNew);
    fts5AssertMultiIterSetup(p, pNew);

    if( pNew->bSkipEmpty && fts5MultiIterIsEmpty(p, pNew) ){
      fts5MultiIterNext(p, pNew, 0, 0);
    }else if( pNew->base.bEof==0 ){
      Fts5SegIter *pSeg = &pNew->aSeg[pNew->aFirst[1].iFirst];
      pNew->xSetOutputs(pNew, pSeg);
    }

  }else{
    fts5MultiIterFree(pNew);
    *ppOut = 0;
  }
}